

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shannon.c
# Opt level: O1

double inform_shannon_pre(inform_dist *p,inform_dist *q,size_t event,double base)

{
  _Bool _Var1;
  double dVar2;
  double dVar3;
  
  _Var1 = inform_dist_is_valid(p);
  dVar2 = NAN;
  if (_Var1) {
    _Var1 = inform_dist_is_valid(q);
    if (_Var1) {
      dVar2 = NAN;
      if (p->size == q->size) {
        dVar2 = inform_dist_prob(p,event);
        dVar3 = inform_dist_prob(q,event);
        dVar2 = log2(dVar2 / dVar3);
        dVar3 = log2(base);
        dVar2 = dVar2 / dVar3;
      }
    }
    else {
      dVar2 = NAN;
    }
  }
  return dVar2;
}

Assistant:

double inform_shannon_pre(inform_dist const *p, inform_dist const *q,
    size_t event, double base)
{
    if (inform_dist_is_valid(p) && inform_dist_is_valid(q) && p->size == q->size)
    {
        double u = inform_dist_prob(p, event);
        double v = inform_dist_prob(q, event);
        return log2(u/v) / log2(base);
    }
    return NAN;
}